

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVhandle_control_message(CManager_conflict cm,CMConnection conn,uchar type,int arg)

{
  int iVar1;
  int s_00;
  stone_type p_Var2;
  int in_ECX;
  byte in_DL;
  EVSimpleHandlerFunc in_RSI;
  long in_RDI;
  stone_type stone;
  int s;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffc8;
  stall_source in_stack_ffffffffffffffd8;
  CManager_conflict cm_00;
  
  cm_00 = *(CManager_conflict *)(in_RDI + 0x118);
  if (in_DL < 2) {
    for (s_00 = *(int *)((long)&cm_00->transports + 4);
        s_00 < *(int *)&cm_00->transports + *(int *)((long)&cm_00->transports + 4); s_00 = s_00 + 1)
    {
      p_Var2 = stone_struct(in_stack_ffffffffffffffc8,0);
      iVar1 = is_bridge_stone((CManager_conflict)CONCAT44(s_00,in_stack_ffffffffffffffd8),
                              (EVstone)((ulong)p_Var2 >> 0x20));
      if (((iVar1 != 0) && (p_Var2->proto_actions[p_Var2->default_action].o.term.handler == in_RSI))
         && (p_Var2->proto_actions[p_Var2->default_action].o.bri.remote_stone_id == in_ECX)) {
        backpressure_transition(cm_00,s_00,in_stack_ffffffffffffffd8,(int)((ulong)p_Var2 >> 0x20));
      }
    }
    return;
  }
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                ,0xc43,
                "void INT_EVhandle_control_message(CManager, CMConnection, unsigned char, int)");
}

Assistant:

void
INT_EVhandle_control_message(CManager cm, CMConnection conn, unsigned char type, int arg) {
    event_path_data evp = cm->evp;
    switch (type) {
    case CONTROL_SQUELCH:
    case CONTROL_UNSQUELCH: {
            int s;
            stone_type stone;
            for (s = evp->stone_base_num; s < evp->stone_count + evp->stone_base_num; ++s) {
                stone = stone_struct(evp, s);
                if (is_bridge_stone(cm, s) &&  stone->proto_actions[stone->default_action].o.bri.conn == conn
                        && stone->proto_actions[stone->default_action].o.bri.remote_stone_id == arg) {
                    backpressure_transition(cm, s, Stall_Squelch, type == CONTROL_SQUELCH);
                }
            }
        }
        break;
    default:
        assert(FALSE);
    }
}